

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O0

void array_sum_bang(t_array_rangeop *x)

{
  float f;
  int iVar1;
  double sum;
  int i;
  int arrayonset;
  int nitem;
  int stride;
  char *firstitem;
  char *itemp;
  t_array_rangeop *x_local;
  
  itemp = (char *)x;
  iVar1 = array_rangeop_getrange(x,(char **)&nitem,&i,&arrayonset,(int *)((long)&sum + 4));
  if (iVar1 != 0) {
    f = 0.0;
    firstitem = _nitem;
    for (sum._0_4_ = 0; sum._0_4_ < i; sum._0_4_ = sum._0_4_ + 1) {
      f = *(float *)firstitem + f;
      firstitem = firstitem + arrayonset;
    }
    outlet_float(*(_outlet **)(itemp + 0x18),f);
  }
  return;
}

Assistant:

static void array_sum_bang(t_array_rangeop *x)
{
    char *itemp, *firstitem;
    int stride, nitem, arrayonset, i;
    double sum;
    if (!array_rangeop_getrange(x, &firstitem, &nitem, &stride, &arrayonset))
        return;
    for (i = 0, sum = 0, itemp = firstitem; i < nitem; i++, itemp += stride)
        sum += *(t_float *)itemp;
    outlet_float(x->x_outlet, sum);
}